

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_log.c
# Opt level: O2

void srunner_end_logging(SRunner *sr)

{
  List *lp;
  int iVar1;
  undefined8 *__ptr;
  
  srunner_send_evt(sr,(void *)0x0,CLENDLOG_SR);
  lp = sr->loglst;
  check_list_front(lp);
  do {
    iVar1 = check_list_at_end(lp);
    if (iVar1 != 0) {
      check_list_free(lp);
      sr->loglst = (List *)0x0;
      return;
    }
    __ptr = (undefined8 *)check_list_val(lp);
    if (*(int *)(__ptr + 2) != 0) {
      iVar1 = fclose((FILE *)*__ptr);
      if (iVar1 != 0) {
        eprintf("Error in call to fclose while closing log file:",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_log.c"
                ,0x224);
      }
    }
    free(__ptr);
    check_list_advance(lp);
  } while( true );
}

Assistant:

void srunner_end_logging(SRunner * sr)
{
    List *l;
    int rval;

    srunner_send_evt(sr, NULL, CLENDLOG_SR);

    l = sr->loglst;
    for(check_list_front(l); !check_list_at_end(l); check_list_advance(l))
    {
        Log *lg = (Log *)check_list_val(l);

        if(lg->close)
        {
            rval = fclose(lg->lfile);
            if(rval != 0)
                eprintf("Error in call to fclose while closing log file:",
                        __FILE__, __LINE__ - 2);
        }
        free(lg);
    }
    check_list_free(l);
    sr->loglst = NULL;
}